

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O1

BasicStringView<char> __thiscall
Corrade::Containers::BasicStringView<char>::findLastOr
          (BasicStringView<char> *this,char character,char *fail)

{
  char *pcVar1;
  char *begin;
  char *pcVar2;
  BasicStringView<char> local_10;
  
  pcVar1 = this->_data;
  if (pcVar1 == (char *)0x0) {
    begin = (char *)0x0;
  }
  else {
    pcVar2 = pcVar1 + (this->_sizePlusFlags & 0x3fffffffffffffff);
    do {
      pcVar2 = pcVar2 + -1;
      begin = (char *)0x0;
      if (pcVar2 < pcVar1) break;
      begin = pcVar2;
    } while (*pcVar2 != character);
  }
  if (begin == (char *)0x0) {
    BasicStringView(&local_10,fail,0,(nullptr_t)0x0);
  }
  else {
    local_10 = slice(this,begin,begin + 1);
  }
  return local_10;
}

Assistant:

inline BasicStringView<T> BasicStringView<T>::findLastOr(const char character, T* const fail) const {
    if(const char* const found = Implementation::stringFindLastCharacter(_data, size(), character))
        return slice(const_cast<T*>(found), const_cast<T*>(found + 1));

    /* Using an internal assert-less constructor, the public constructor
       asserts would be redundant. Since it's a zero-sized view, it doesn't
       really make sense to try to preserve any flags. */
    return BasicStringView<T>{fail, 0 /* empty, no flags */, nullptr};
}